

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O3

string * __thiscall ConfigFile::trim(string *__return_storage_ptr__,ConfigFile *this,string *str)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  pointer pcVar7;
  pointer pcVar8;
  char *pcVar9;
  long lVar10;
  pointer pcVar11;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar8 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar8,pcVar8 + str->_M_string_length);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar6 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar2 + uVar6;
  pcVar5 = pcVar2;
  if (0 < (long)uVar6 >> 2) {
    pcVar5 = pcVar2 + (uVar6 & 0xfffffffffffffffc);
    lVar10 = ((long)uVar6 >> 2) + 1;
    pcVar9 = pcVar2 + 3;
    do {
      iVar4 = isspace((int)pcVar9[-3]);
      if (iVar4 == 0) {
        pcVar9 = pcVar9 + -3;
        goto LAB_0013d12b;
      }
      iVar4 = isspace((int)pcVar9[-2]);
      if (iVar4 == 0) {
        pcVar9 = pcVar9 + -2;
        goto LAB_0013d12b;
      }
      iVar4 = isspace((int)pcVar9[-1]);
      if (iVar4 == 0) {
        pcVar9 = pcVar9 + -1;
        goto LAB_0013d12b;
      }
      iVar4 = isspace((int)*pcVar9);
      if (iVar4 == 0) goto LAB_0013d12b;
      lVar10 = lVar10 + -1;
      pcVar9 = pcVar9 + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)pcVar1 - (long)pcVar5;
  if (lVar10 == 1) {
LAB_0013d108:
    iVar4 = isspace((int)*pcVar5);
    pcVar9 = pcVar5;
    if (iVar4 != 0) {
      pcVar9 = pcVar1;
    }
LAB_0013d12b:
    if (pcVar1 == pcVar9) goto LAB_0013d142;
    std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,0);
  }
  else {
    if (lVar10 == 2) {
LAB_0013d0f8:
      iVar4 = isspace((int)*pcVar5);
      pcVar9 = pcVar5;
      if (iVar4 != 0) {
        pcVar5 = pcVar5 + 1;
        goto LAB_0013d108;
      }
      goto LAB_0013d12b;
    }
    if (lVar10 == 3) {
      iVar4 = isspace((int)*pcVar5);
      pcVar9 = pcVar5;
      if (iVar4 != 0) {
        pcVar5 = pcVar5 + 1;
        goto LAB_0013d0f8;
      }
      goto LAB_0013d12b;
    }
LAB_0013d142:
    __return_storage_ptr__->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar6 = __return_storage_ptr__->_M_string_length;
  pcVar8 = pcVar3 + uVar6;
  lVar10 = (long)uVar6 >> 2;
  pcVar11 = pcVar8;
  if (0 < lVar10) {
    pcVar11 = pcVar8 + -(uVar6 & 0xfffffffffffffffc);
    pcVar8 = pcVar8 + lVar10 * -4;
    lVar10 = lVar10 + 1;
    do {
      iVar4 = isspace((int)pcVar3[uVar6 - 1]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + uVar6;
        goto LAB_0013d269;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 2]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 1);
        goto LAB_0013d269;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 3]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 2);
        goto LAB_0013d269;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 4]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 3);
        goto LAB_0013d269;
      }
      uVar6 = uVar6 - 4;
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  lVar10 = (long)pcVar11 - (long)pcVar3;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      pcVar7 = pcVar3;
      if ((lVar10 != 3) || (iVar4 = isspace((int)pcVar11[-1]), pcVar7 = pcVar11, iVar4 == 0))
      goto LAB_0013d269;
      pcVar11 = pcVar8 + -1;
      pcVar8 = pcVar11;
    }
    iVar4 = isspace((int)pcVar11[-1]);
    pcVar7 = pcVar11;
    if (iVar4 == 0) goto LAB_0013d269;
    pcVar11 = pcVar8 + -1;
  }
  iVar4 = isspace((int)pcVar11[-1]);
  pcVar7 = pcVar11;
  if (iVar4 != 0) {
    pcVar7 = pcVar3;
  }
LAB_0013d269:
  __return_storage_ptr__->_M_string_length = (long)pcVar7 - (long)pcVar3;
  *pcVar7 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
ConfigFile::trim(const std::string &str) {
  std::string tmp = str;
  tmp.erase(tmp.begin(),
            std::find_if(tmp.begin(), tmp.end(),
                         [](int c) {return !std::isspace(c);}));
  tmp.erase(std::find_if(tmp.rbegin(), tmp.rend(),
                         [](int c) {return !std::isspace(c);})
                .base(),
            tmp.end());

  return tmp;
}